

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall Edge::Dump(Edge *this,char *prefix)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  reference ppNVar4;
  ulong uVar5;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_48;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_40;
  const_iterator i_2;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_30;
  const_iterator i_1;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_20;
  const_iterator i;
  char *prefix_local;
  Edge *this_local;
  
  i._M_current = (Node **)prefix;
  printf("%s[ ",prefix);
  local_20._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->inputs_)
  ;
  while( true ) {
    i_1 = std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->inputs_);
    bVar1 = __gnu_cxx::operator!=(&local_20,&i_1);
    bVar2 = false;
    if (bVar1) {
      ppNVar4 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_20);
      bVar2 = *ppNVar4 != (Node *)0x0;
    }
    if (!bVar2) break;
    ppNVar4 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_20);
    Node::path_abi_cxx11_(*ppNVar4);
    uVar3 = std::__cxx11::string::c_str();
    printf("%s ",uVar3);
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_20);
  }
  Rule::name_abi_cxx11_(this->rule_);
  uVar3 = std::__cxx11::string::c_str();
  printf("--%s-> ",uVar3);
  local_30._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->outputs_);
  while( true ) {
    i_2 = std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->outputs_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&i_2);
    bVar2 = false;
    if (bVar1) {
      ppNVar4 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_30);
      bVar2 = *ppNVar4 != (Node *)0x0;
    }
    if (!bVar2) break;
    ppNVar4 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_30);
    Node::path_abi_cxx11_(*ppNVar4);
    uVar3 = std::__cxx11::string::c_str();
    printf("%s ",uVar3);
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_30);
  }
  bVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(&this->validations_);
  if (!bVar2) {
    printf(" validations ");
    local_40._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->validations_);
    while( true ) {
      local_48._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->validations_);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
      bVar2 = false;
      if (bVar1) {
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_40);
        bVar2 = *ppNVar4 != (Node *)0x0;
      }
      if (!bVar2) break;
      ppNVar4 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_40);
      Node::path_abi_cxx11_(*ppNVar4);
      uVar3 = std::__cxx11::string::c_str();
      printf("%s ",uVar3);
      __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_40);
    }
  }
  if (this->pool_ == (Pool *)0x0) {
    printf("(null pool?)");
  }
  else {
    Pool::name_abi_cxx11_(this->pool_);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Pool::name_abi_cxx11_(this->pool_);
      uVar3 = std::__cxx11::string::c_str();
      printf("(in pool \'%s\')",uVar3);
    }
  }
  printf("] 0x%p\n",this);
  return;
}

Assistant:

void Edge::Dump(const char* prefix) const {
  printf("%s[ ", prefix);
  for (vector<Node*>::const_iterator i = inputs_.begin();
       i != inputs_.end() && *i != NULL; ++i) {
    printf("%s ", (*i)->path().c_str());
  }
  printf("--%s-> ", rule_->name().c_str());
  for (vector<Node*>::const_iterator i = outputs_.begin();
       i != outputs_.end() && *i != NULL; ++i) {
    printf("%s ", (*i)->path().c_str());
  }
  if (!validations_.empty()) {
    printf(" validations ");
    for (std::vector<Node*>::const_iterator i = validations_.begin();
         i != validations_.end() && *i != NULL; ++i) {
      printf("%s ", (*i)->path().c_str());
    }
  }
  if (pool_) {
    if (!pool_->name().empty()) {
      printf("(in pool '%s')", pool_->name().c_str());
    }
  } else {
    printf("(null pool?)");
  }
  printf("] 0x%p\n", this);
}